

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<3UL>::add(WorkerJob<3UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  bool bVar1;
  
  this->m_sequence = (&Nonce::m_sequence)[backend];
  bVar1 = Job::isEqual(this->m_jobs + this->m_index,job);
  if (bVar1) {
    return;
  }
  if (((this->m_index == '\x01') && (job->m_index == '\0')) &&
     (bVar1 = Job::isEqual(job,this->m_jobs), bVar1)) {
    this->m_index = '\0';
    return;
  }
  save(this,job,reserveCount,backend);
  return;
}

Assistant:

inline void add(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
    {
        m_sequence = Nonce::sequence(backend);

        if (currentJob() == job) {
            return;
        }

        if (index() == 1 && job.index() == 0 && job == m_jobs[0]) {
            m_index = 0;
            return;
        }

        save(job, reserveCount, backend);
    }